

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O2

void usage(int exitCode)

{
  FILE *__stream;
  char *pcVar1;
  
  __stream = _stderr;
  pcVar1 = llbuild::commands::getProgramName();
  fprintf(__stream,"Usage: %s ninja build [options] [<targets>...]\n",pcVar1);
  fwrite("\nOptions:\n",10,1,_stderr);
  fprintf(_stderr,"  %-*s %s\n",0x14,"--help","show this help message and exit");
  fprintf(_stderr,"  %-*s %s\n",0x14,"--version","print the Ninja compatible version number");
  fprintf(_stderr,"  %-*s %s\n",0x14,"--simulate","simulate the build, assuming commands succeed");
  fprintf(_stderr,"  %-*s %s\n",0x14,"-C, --chdir <PATH>",
          "change directory to PATH before anything else");
  fprintf(_stderr,"  %-*s %s\n",0x14,"--no-db","do not persist build results");
  fprintf(_stderr,"  %-*s %s\n",0x14,"--db <PATH>",
          "persist build results at PATH [default=\'build.db\']");
  fprintf(_stderr,"  %-*s %s\n",0x14,"-f <PATH>",
          "load the manifest at PATH [default=\'build.ninja\']");
  fprintf(_stderr,"  %-*s %s\n",0x14,"-k <N>","keep building until N commands fail [default=1]");
  fprintf(_stderr,"  %-*s %s\n",0x14,"-t, --tool <TOOL>",
          "run a ninja tool. use \'list\' to list available tools.");
  fprintf(_stderr,"  %-*s %s\n",0x14,"-j, --jobs <JOBS>",
          "number of jobs to build in parallel [default=cpu dependent]");
  fprintf(_stderr,"  %-*s %s\n",0x14,"--scheduler <SCHEDULER>","set scheduler algorithm");
  fprintf(_stderr,"  %-*s %s\n",0x14,"--no-regenerate","disable manifest auto-regeneration");
  fprintf(_stderr,"  %-*s %s\n",0x14,"--dump-graph <PATH>",
          "dump build graph to PATH in Graphviz DOT format");
  fprintf(_stderr,"  %-*s %s\n",0x14,"--profile <PATH>",
          "write a build profile trace event file to PATH");
  fprintf(_stderr,"  %-*s %s\n",0x14,"--strict","use strict mode (no bug compatibility)");
  fprintf(_stderr,"  %-*s %s\n",0x14,"--trace <PATH>","trace build engine operation to PATH");
  fprintf(_stderr,"  %-*s %s\n",0x14,"--quiet","don\'t show information on executed commands");
  fprintf(_stderr,"  %-*s %s\n",0x14,"-v, --verbose","show full invocation for executed commands");
  fprintf(_stderr,"  %-*s %s\n",0x14,"-l <N>",
          "start jobs only when load average is below N [not implemented]");
  fprintf(_stderr,"  %-*s %s\n",0x14,"-d <TOOL>",
          "enable debugging tool TOOL. \'list\' for available [not implemented]");
  exit(exitCode);
}

Assistant:

static void usage(int exitCode=1) {
  int optionWidth = 20;
  fprintf(stderr, "Usage: %s ninja build [options] [<targets>...]\n",
          getProgramName());
  fprintf(stderr, "\nOptions:\n");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--help",
          "show this help message and exit");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--version",
          "print the Ninja compatible version number");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--simulate",
          "simulate the build, assuming commands succeed");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "-C, --chdir <PATH>",
          "change directory to PATH before anything else");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--no-db",
          "do not persist build results");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--db <PATH>",
          "persist build results at PATH [default='build.db']");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "-f <PATH>",
          "load the manifest at PATH [default='build.ninja']");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "-k <N>",
          "keep building until N commands fail [default=1]");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "-t, --tool <TOOL>",
          "run a ninja tool. use 'list' to list available tools.");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "-j, --jobs <JOBS>",
          "number of jobs to build in parallel [default=cpu dependent]");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--scheduler <SCHEDULER>",
          "set scheduler algorithm");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--no-regenerate",
          "disable manifest auto-regeneration");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--dump-graph <PATH>",
          "dump build graph to PATH in Graphviz DOT format");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--profile <PATH>",
          "write a build profile trace event file to PATH");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--strict",
          "use strict mode (no bug compatibility)");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--trace <PATH>",
          "trace build engine operation to PATH");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--quiet",
          "don't show information on executed commands");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "-v, --verbose",
          "show full invocation for executed commands");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "-l <N>",
          "start jobs only when load average is below N [not implemented]");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "-d <TOOL>",
          "enable debugging tool TOOL. 'list' for available [not implemented]");
  ::exit(exitCode);
}